

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O2

void polymul_internal::taylor_inplace_multiplier<double,_4,_2,_5,_2>::mul(double *p1,double *p2)

{
  int iVar1;
  long lVar2;
  
  iVar1 = binomial(5,1);
  lVar2 = (long)iVar1;
  while( true ) {
    iVar1 = binomial(6,2);
    if (iVar1 <= lVar2) break;
    p1[lVar2] = p2[lVar2] * *p1 + p1[lVar2];
    lVar2 = lVar2 + 1;
  }
  taylor_inplace_multiplier<double,_4,_1,_5,_0>::mul(p1,p2);
  return;
}

Assistant:

static void mul(numtype POLYMUL_RESTRICT p1[], const numtype p2[]) {
    if (Ndeg <= Ndeg2) {
      for (int i = binomial(Nvar + Ndeg - 1, Ndeg - 1);
           i < binomial(Nvar + Ndeg, Ndeg);
           i++)
        p1[i] += p2[i] * p1[0];
    }
    taylor_inplace_multiplier<numtype, Nvar, Ndeg - 1, Ndeg2, 0>::mul(
        p1, p2); // Do lower degree terms, or go to (4)
  }